

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void delay_move(_glist *x)

{
  int dx;
  int dy;
  int incy;
  int incx;
  _glist *x_local;
  
  dx = (x->gl_editor->e_xnew - x->gl_editor->e_xwas) / x->gl_zoom;
  dy = (x->gl_editor->e_ynew - x->gl_editor->e_ywas) / x->gl_zoom;
  if ((dx != 0) || (dy != 0)) {
    canvas_displaceselection(x,dx,dy);
  }
  x->gl_editor->e_xwas = dx * x->gl_zoom + x->gl_editor->e_xwas;
  x->gl_editor->e_ywas = dy * x->gl_zoom + x->gl_editor->e_ywas;
  return;
}

Assistant:

static void delay_move(t_canvas *x)
{
    int incx = (x->gl_editor->e_xnew - x->gl_editor->e_xwas)/x->gl_zoom,
        incy = (x->gl_editor->e_ynew - x->gl_editor->e_ywas)/x->gl_zoom;
    if (incx || incy)
        canvas_displaceselection(x, incx, incy);
    x->gl_editor->e_xwas += incx * x->gl_zoom;
    x->gl_editor->e_ywas += incy * x->gl_zoom;
}